

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O2

unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_> * __thiscall
dlib::
array<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
::element(array<std::unique_ptr<dlib::thread_function,_std::default_delete<dlib::thread_function>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
          *this)

{
  return this->pos;
}

Assistant:

const T& array<T,mem_manager>::
    element (
    ) const
    {
        // make sure requires clause is not broken
        DLIB_ASSERT(this->current_element_valid(),
            "\tconst T& array::element()"
            << "\n\tThe current element must be valid if you are to access it."
            << "\n\tthis: " << this
            );

        return *pos;
    }